

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_monitor.c
# Opt level: O0

GLFWvidmode *
vidmodeFromModeInfo(GLFWvidmode *__return_storage_ptr__,XRRModeInfo *mi,XRRCrtcInfo *ci)

{
  int iVar1;
  XRRCrtcInfo *ci_local;
  XRRModeInfo *mi_local;
  
  if ((ci->rotation == 2) || (ci->rotation == 8)) {
    __return_storage_ptr__->width = mi->height;
    __return_storage_ptr__->height = mi->width;
  }
  else {
    __return_storage_ptr__->width = mi->width;
    __return_storage_ptr__->height = mi->height;
  }
  iVar1 = calculateRefreshRate(mi);
  __return_storage_ptr__->refreshRate = iVar1;
  _glfwSplitBPP(*(int *)(*(long *)(_glfw.x11.display + 0xe8) + (long)_glfw.x11.screen * 0x80 + 0x38)
                ,&__return_storage_ptr__->redBits,&__return_storage_ptr__->greenBits,
                &__return_storage_ptr__->blueBits);
  return __return_storage_ptr__;
}

Assistant:

static GLFWvidmode vidmodeFromModeInfo(const XRRModeInfo* mi,
                                       const XRRCrtcInfo* ci)
{
    GLFWvidmode mode;

    if (ci->rotation == RR_Rotate_90 || ci->rotation == RR_Rotate_270)
    {
        mode.width  = mi->height;
        mode.height = mi->width;
    }
    else
    {
        mode.width  = mi->width;
        mode.height = mi->height;
    }

    mode.refreshRate = calculateRefreshRate(mi);

    _glfwSplitBPP(DefaultDepth(_glfw.x11.display, _glfw.x11.screen),
                  &mode.redBits, &mode.greenBits, &mode.blueBits);

    return mode;
}